

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O1

CURLcode Curl_auth_create_digest_md5_message
                   (Curl_easy *data,bufref *chlg,char *userp,char *passwdp,char *service,bufref *out
                   )

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  uchar *puVar6;
  size_t sVar7;
  MD5_context *pMVar8;
  size_t sVar9;
  bool bVar10;
  char **linep;
  Curl_str *out_00;
  char *pcVar11;
  long lVar12;
  char qop [5];
  uchar digest [16];
  char nonceCount [9];
  char method [13];
  char cnonce [33];
  char nonce [64];
  char resp_hash_hex [33];
  char HA2_hex [33];
  char HA1_hex [33];
  char algorithm [64];
  char qop_options [64];
  char realm [128];
  
  builtin_strncpy(nonceCount,"00000001",9);
  builtin_strncpy(method + 8,"CATE",5);
  builtin_strncpy(method,"AUTHENTI",8);
  builtin_strncpy(qop,"auth",5);
  puVar6 = Curl_bufref_ptr(chlg);
  sVar7 = Curl_bufref_len(chlg);
  CVar4 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar7 != 0) &&
     (_Var2 = auth_digest_get_key_value((char *)puVar6,"nonce=\"",nonce,0x40,'\"'), _Var2)) {
    _Var2 = auth_digest_get_key_value((char *)puVar6,"realm=\"",realm,0x80,'\"');
    if (!_Var2) {
      realm[0] = '\0';
    }
    _Var2 = auth_digest_get_key_value((char *)puVar6,"algorithm=",algorithm,0x40,',');
    if (_Var2) {
      _Var2 = auth_digest_get_key_value((char *)puVar6,"qop=\"",qop_options,0x40,'\"');
      CVar4 = CURLE_BAD_CONTENT_ENCODING;
      if (_Var2) {
        CVar4 = CURLE_OK;
      }
    }
  }
  if ((CVar4 == CURLE_OK) &&
     (CVar4 = CURLE_BAD_CONTENT_ENCODING,
     algorithm[8] == '\0' && algorithm._0_8_ == 0x737365732d35646d)) {
    HA2_hex._0_8_ = qop_options;
    linep = (char **)HA2_hex;
    bVar10 = false;
    out_00 = (Curl_str *)HA1_hex;
    do {
      iVar3 = Curl_str_until(linep,out_00,0x20,',');
      if (iVar3 != 0) break;
      iVar3 = Curl_str_casecompare(out_00,"auth");
      bVar1 = true;
      if ((iVar3 == 0) &&
         (iVar3 = Curl_str_casecompare(out_00,"auth-int"), bVar1 = bVar10, iVar3 == 0)) {
        Curl_str_casecompare(out_00,"auth-conf");
      }
      bVar10 = bVar1;
      iVar3 = Curl_str_single(linep,',');
    } while (iVar3 == 0);
    if ((bVar10) && (CVar4 = Curl_rand_hex(data,(uchar *)cnonce,0x21), CVar4 == CURLE_OK)) {
      pMVar8 = Curl_MD5_init(&Curl_DIGEST_MD5);
      CVar4 = CURLE_OUT_OF_MEMORY;
      if (pMVar8 != (MD5_context *)0x0) {
        sVar9 = strlen(userp);
        uVar5 = curlx_uztoui(sVar9);
        Curl_MD5_update(pMVar8,(uchar *)userp,uVar5);
        Curl_MD5_update(pMVar8,":",1);
        sVar9 = strlen(realm);
        uVar5 = curlx_uztoui(sVar9);
        Curl_MD5_update(pMVar8,(uchar *)realm,uVar5);
        Curl_MD5_update(pMVar8,":",1);
        sVar9 = strlen(passwdp);
        uVar5 = curlx_uztoui(sVar9);
        Curl_MD5_update(pMVar8,(uchar *)passwdp,uVar5);
        Curl_MD5_final(pMVar8,digest);
        pMVar8 = Curl_MD5_init(&Curl_DIGEST_MD5);
        if (pMVar8 != (MD5_context *)0x0) {
          Curl_MD5_update(pMVar8,digest,0x10);
          Curl_MD5_update(pMVar8,":",1);
          sVar9 = strlen(nonce);
          uVar5 = curlx_uztoui(sVar9);
          Curl_MD5_update(pMVar8,(uchar *)nonce,uVar5);
          Curl_MD5_update(pMVar8,":",1);
          sVar9 = strlen(cnonce);
          uVar5 = curlx_uztoui(sVar9);
          Curl_MD5_update(pMVar8,(uchar *)cnonce,uVar5);
          Curl_MD5_final(pMVar8,digest);
          lVar12 = 0;
          do {
            curl_msnprintf((char *)out_00,3,"%02x",(ulong)digest[lVar12]);
            lVar12 = lVar12 + 1;
            out_00 = (Curl_str *)((long)&out_00->str + 2);
          } while (lVar12 != 0x10);
          puVar6 = (uchar *)Curl_auth_build_spn(service,(data->conn->host).name,(char *)0x0);
          if (puVar6 != (uchar *)0x0) {
            pMVar8 = Curl_MD5_init(&Curl_DIGEST_MD5);
            if (pMVar8 != (MD5_context *)0x0) {
              sVar9 = strlen(method);
              uVar5 = curlx_uztoui(sVar9);
              Curl_MD5_update(pMVar8,(uchar *)method,uVar5);
              Curl_MD5_update(pMVar8,":",1);
              sVar9 = strlen((char *)puVar6);
              uVar5 = curlx_uztoui(sVar9);
              Curl_MD5_update(pMVar8,puVar6,uVar5);
              Curl_MD5_final(pMVar8,digest);
              lVar12 = 0;
              do {
                curl_msnprintf((char *)linep,3,"%02x",(ulong)digest[lVar12]);
                lVar12 = lVar12 + 1;
                linep = (char **)((long)linep + 2);
              } while (lVar12 != 0x10);
              pMVar8 = Curl_MD5_init(&Curl_DIGEST_MD5);
              if (pMVar8 != (MD5_context *)0x0) {
                Curl_MD5_update(pMVar8,(uchar *)HA1_hex,0x20);
                Curl_MD5_update(pMVar8,":",1);
                sVar9 = strlen(nonce);
                uVar5 = curlx_uztoui(sVar9);
                Curl_MD5_update(pMVar8,(uchar *)nonce,uVar5);
                Curl_MD5_update(pMVar8,":",1);
                sVar9 = strlen(nonceCount);
                uVar5 = curlx_uztoui(sVar9);
                Curl_MD5_update(pMVar8,(uchar *)nonceCount,uVar5);
                Curl_MD5_update(pMVar8,":",1);
                sVar9 = strlen(cnonce);
                uVar5 = curlx_uztoui(sVar9);
                Curl_MD5_update(pMVar8,(uchar *)cnonce,uVar5);
                Curl_MD5_update(pMVar8,":",1);
                sVar9 = strlen(qop);
                uVar5 = curlx_uztoui(sVar9);
                Curl_MD5_update(pMVar8,(uchar *)qop,uVar5);
                Curl_MD5_update(pMVar8,":",1);
                Curl_MD5_update(pMVar8,(uchar *)HA2_hex,0x20);
                Curl_MD5_final(pMVar8,digest);
                pcVar11 = resp_hash_hex;
                lVar12 = 0;
                do {
                  curl_msnprintf(pcVar11,3,"%02x",(ulong)digest[lVar12]);
                  lVar12 = lVar12 + 1;
                  pcVar11 = pcVar11 + 2;
                } while (lVar12 != 0x10);
                pcVar11 = curl_maprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\",cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,qop=%s"
                                        ,userp,realm,nonce,cnonce,nonceCount,puVar6,resp_hash_hex,
                                        qop);
                (*Curl_cfree)(puVar6);
                if (pcVar11 == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
                sVar9 = strlen(pcVar11);
                Curl_bufref_set(out,pcVar11,sVar9,curl_free);
                return CURLE_OK;
              }
            }
            (*Curl_cfree)(puVar6);
          }
        }
      }
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_auth_create_digest_md5_message(struct Curl_easy *data,
                                             const struct bufref *chlg,
                                             const char *userp,
                                             const char *passwdp,
                                             const char *service,
                                             struct bufref *out)
{
  size_t i;
  struct MD5_context *ctxt;
  char *response = NULL;
  unsigned char digest[MD5_DIGEST_LEN];
  char HA1_hex[2 * MD5_DIGEST_LEN + 1];
  char HA2_hex[2 * MD5_DIGEST_LEN + 1];
  char resp_hash_hex[2 * MD5_DIGEST_LEN + 1];
  char nonce[64];
  char realm[128];
  char algorithm[64];
  char qop_options[64];
  int qop_values;
  char cnonce[33];
  char nonceCount[] = "00000001";
  char method[]     = "AUTHENTICATE";
  char qop[]        = DIGEST_QOP_VALUE_STRING_AUTH;
  char *spn         = NULL;

  /* Decode the challenge message */
  CURLcode result = auth_decode_digest_md5_message(chlg,
                                                   nonce, sizeof(nonce),
                                                   realm, sizeof(realm),
                                                   algorithm,
                                                   sizeof(algorithm),
                                                   qop_options,
                                                   sizeof(qop_options));
  if(result)
    return result;

  /* We only support md5 sessions */
  if(strcmp(algorithm, "md5-sess") != 0)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Get the qop-values from the qop-options */
  result = auth_digest_get_qop_values(qop_options, &qop_values);
  if(result)
    return result;

  /* We only support auth quality-of-protection */
  if(!(qop_values & DIGEST_QOP_VALUE_AUTH))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Generate 32 random hex chars, 32 bytes + 1 null-termination */
  result = Curl_rand_hex(data, (unsigned char *)cnonce, sizeof(cnonce));
  if(result)
    return result;

  /* So far so good, now calculate A1 and H(A1) according to RFC 2831 */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) userp,
                  curlx_uztoui(strlen(userp)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) realm,
                  curlx_uztoui(strlen(realm)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) passwdp,
                  curlx_uztoui(strlen(passwdp)));
  Curl_MD5_final(ctxt, digest);

  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) digest, MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_final(ctxt, digest);

  /* Convert calculated 16 octet hex into 32 bytes string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&HA1_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate our SPN */
  spn = Curl_auth_build_spn(service, data->conn->host.name, NULL);
  if(!spn)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate H(A2) */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) method,
                  curlx_uztoui(strlen(method)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) spn,
                  curlx_uztoui(strlen(spn)));
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&HA2_hex[2 * i], 3, "%02x", digest[i]);

  /* Now calculate the response hash */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) HA1_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) nonceCount,
                  curlx_uztoui(strlen(nonceCount)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) qop,
                  curlx_uztoui(strlen(qop)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) HA2_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&resp_hash_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate the response */
  response = aprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\","
                     "cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,"
                     "qop=%s",
                     userp, realm, nonce,
                     cnonce, nonceCount, spn, resp_hash_hex, qop);
  free(spn);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Return the response. */
  Curl_bufref_set(out, response, strlen(response), curl_free);
  return result;
}